

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlparse.c
# Opt level: O3

XML_Index XML_GetCurrentByteIndex(XML_Parser parser)

{
  char *pcVar1;
  
  pcVar1 = (char *)0xffffffffffffffff;
  if ((parser != (XML_Parser)0x0) && (parser->m_eventPtr != (char *)0x0)) {
    pcVar1 = parser->m_eventPtr + (parser->m_parseEndByteIndex - (long)parser->m_parseEndPtr);
  }
  return (XML_Index)pcVar1;
}

Assistant:

XML_Index XMLCALL
XML_GetCurrentByteIndex(XML_Parser parser) {
  if (parser == NULL)
    return -1;
  if (parser->m_eventPtr)
    return (XML_Index)(parser->m_parseEndByteIndex
                       - (parser->m_parseEndPtr - parser->m_eventPtr));
  return -1;
}